

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O1

void __thiscall
Js::RecyclableMethodsGroupWalker::AddItem
          (RecyclableMethodsGroupWalker *this,PropertyId propertyId,Var obj)

{
  int iVar1;
  code *pcVar2;
  bool bVar3;
  ArenaAllocator *pAVar4;
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  *pLVar5;
  undefined4 *puVar6;
  DebuggerPropertyDisplayInfo *pDVar7;
  
  if ((this->super_RecyclableObjectWalker).pMembersList ==
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    pAVar4 = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
    pLVar5 = (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
              *)new<Memory::ArenaAllocator>(0x30,pAVar4,0x366bee);
    (pLVar5->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    buffer = (Type)0x0;
    (pLVar5->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    count = 0;
    (pLVar5->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    alloc = pAVar4;
    (pLVar5->
    super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
    _vptr_ReadOnlyList = (_func_int **)&PTR_IsReadOnly_014f9c80;
    pLVar5->length = 0;
    pLVar5->increment = 4;
    (this->super_RecyclableObjectWalker).pMembersList = pLVar5;
  }
  if ((this->super_RecyclableObjectWalker).pMembersList ==
      (List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
       *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar6 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagObjectModel.cpp"
                                ,0xf38,"(pMembersList)","pMembersList");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar6 = 0;
  }
  pAVar4 = GetArenaFromContext((this->super_RecyclableObjectWalker).scriptContext);
  pDVar7 = (DebuggerPropertyDisplayInfo *)new<Memory::ArenaAllocator>(0x18,pAVar4,0x366bee);
  pDVar7->propId = propertyId;
  pDVar7->aVar = obj;
  pDVar7->flags = 1;
  pLVar5 = (this->super_RecyclableObjectWalker).pMembersList;
  JsUtil::
  List<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::EnsureArray(pLVar5,0);
  iVar1 = (pLVar5->
          super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>
          ).count;
  (pLVar5->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  buffer[iVar1] = pDVar7;
  (pLVar5->
  super_ReadOnlyList<Js::DebuggerPropertyDisplayInfo_*,_Memory::ArenaAllocator,_DefaultComparer>).
  count = iVar1 + 1;
  return;
}

Assistant:

void RecyclableMethodsGroupWalker::AddItem(Js::PropertyId propertyId, Var obj)
    {
        if (pMembersList == nullptr)
        {
            pMembersList = JsUtil::List<DebuggerPropertyDisplayInfo *, ArenaAllocator>::New(GetArenaFromContext(scriptContext));
        }

        Assert(pMembersList);

        DebuggerPropertyDisplayInfo *info = Anew(GetArenaFromContext(scriptContext), DebuggerPropertyDisplayInfo, propertyId, obj, DebuggerPropertyDisplayInfoFlags_Const);
        Assert(info);
        pMembersList->Add(info);
    }